

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.h
# Opt level: O3

void __thiscall FS::StateStack::pop(StateStack *this)

{
  pointer paVar1;
  pointer paVar2;
  
  paVar1 = (this->stack).
           super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (this->stack).
           super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->stack).
  super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar2;
  if (10 < (ulong)(((long)paVar2 - (long)paVar1 >> 2) * -0x5555555555555555)) {
    push(this,ERROR_STATE,(StateArg)0x10600000001);
    paVar1 = (this->stack).
             super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar2 = (this->stack).
             super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (paVar1 != paVar2) {
    return;
  }
  push(this,ERROR_STATE,(StateArg)0x10b00000001);
  return;
}

Assistant:

void pop( void )
  {
    stack.pop_back();
    if ( stack.size() > 10 ) 
    {
      push( State::ERROR_STATE, StateArg(__LINE__) ); 
    }
    if ( stack.empty() ) 
    {
      // bug, should never happen.
      push( State::ERROR_STATE, StateArg(__LINE__) ); 
    }
  }